

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# way.cc
# Opt level: O2

void re2c::fprint_way(FILE *f,way_t *w)

{
  uint uVar1;
  uint uVar2;
  pointer ppvVar3;
  pointer ppvVar4;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *pvVar5;
  int *piVar6;
  long lVar7;
  FILE *__stream;
  long lVar8;
  size_t i;
  long lVar9;
  long lVar10;
  
  fputc(0x27,(FILE *)f);
  ppvVar3 = (w->
            super__Vector_base<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  ppvVar4 = (w->
            super__Vector_base<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  for (lVar10 = 0; lVar10 != (long)ppvVar3 - (long)ppvVar4 >> 3; lVar10 = lVar10 + 1) {
    if (lVar10 != 0) {
      fputc(0x20,(FILE *)f);
    }
    __stream = _stderr;
    pvVar5 = (w->
             super__Vector_base<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>
             )._M_impl.super__Vector_impl_data._M_start[lVar10];
    if (pvVar5 == (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)0x0) {
      fwrite("(nil)",5,1,_stderr);
    }
    else {
      piVar6 = *(int **)&(pvVar5->
                         super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         )._M_impl.super__Vector_impl_data;
      lVar8 = (long)*(pointer *)
                     ((long)&(pvVar5->
                             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                             )._M_impl.super__Vector_impl_data + 8) - (long)piVar6;
      if ((lVar8 == 8) && (*piVar6 == piVar6[1])) {
        fprintf(_stderr,"\\x%X");
      }
      else {
        fputc(0x5b,_stderr);
        for (lVar9 = 0; lVar8 >> 3 != lVar9; lVar9 = lVar9 + 1) {
          lVar7 = *(long *)&(pvVar5->
                            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                            )._M_impl.super__Vector_impl_data;
          uVar1 = *(uint *)(lVar7 + lVar9 * 8);
          uVar2 = *(uint *)(lVar7 + 4 + lVar9 * 8);
          fprintf(__stream,"\\x%X",(ulong)uVar1);
          if (uVar1 != uVar2) {
            fprintf(__stream,"-\\x%X",(ulong)uVar2);
          }
        }
        fputc(0x5d,__stream);
      }
    }
  }
  fputc(0x27,(FILE *)f);
  return;
}

Assistant:

void fprint_way (FILE * f, const way_t & w)
{
	fprintf (f, "'");
	const size_t len = w.size ();
	for (size_t i = 0 ; i < len; ++i)
	{
		if (i > 0)
		{
			fprintf (f, " ");
		}
		if (w[i] == NULL)
		{
			fprintf (stderr, "(nil)");
		}
		else
		{
			fprint_way_arc (stderr, *w[i]);
		}
	}
	fprintf (f, "'");
}